

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O2

void __thiscall
base::internal::HookList<void_(*)(const_void_*)>::FixupPrivEndLocked
          (HookList<void_(*)(const_void_*)> *this)

{
  __int_type _Var1;
  long lVar2;
  __int_type _Var3;
  
  _Var1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
  lVar2 = _Var1 << 0x20;
  do {
    _Var3 = _Var1;
    lVar2 = lVar2 + -0x100000000;
    if (_Var3 == 0) break;
    _Var1 = _Var3 - 1;
  } while (*(long *)((long)this->priv_data + (lVar2 >> 0x1d)) == 0);
  (this->priv_end).super___atomic_base<unsigned_long>._M_i = _Var3;
  return;
}

Assistant:

void HookList<T>::FixupPrivEndLocked() {
  uintptr_t hooks_end = priv_end.load(std::memory_order_relaxed);
  while ((hooks_end > 0) &&
         cast_priv_data(hooks_end-1)->load(std::memory_order_relaxed) == 0) {
    --hooks_end;
  }
  priv_end.store(hooks_end, std::memory_order_relaxed);
}